

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O0

void webrtc::StoreAsComplex(float *data,float (*data_complex) [65])

{
  int local_1c;
  int i;
  float (*data_complex_local) [65];
  float *data_local;
  
  (*data_complex)[0] = *data;
  data_complex[1][0] = 0.0;
  for (local_1c = 1; local_1c < 0x40; local_1c = local_1c + 1) {
    (*data_complex)[local_1c] = data[local_1c << 1];
    data_complex[1][local_1c] = data[local_1c * 2 + 1];
  }
  (*data_complex)[0x40] = data[1];
  data_complex[1][0x40] = 0.0;
  return;
}

Assistant:

__inline static void StoreAsComplex(const float* data,
                                    float data_complex[2][PART_LEN1]) {
  int i;
  data_complex[0][0] = data[0];
  data_complex[1][0] = 0;
  for (i = 1; i < PART_LEN; i++) {
    data_complex[0][i] = data[2 * i];
    data_complex[1][i] = data[2 * i + 1];
  }
  data_complex[0][PART_LEN] = data[1];
  data_complex[1][PART_LEN] = 0;
}